

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autocorrelation_to_composite_sinusoidal_modeling.cc
# Opt level: O3

void __thiscall
sptk::AutocorrelationToCompositeSinusoidalModeling::AutocorrelationToCompositeSinusoidalModeling
          (AutocorrelationToCompositeSinusoidalModeling *this,int num_order,int num_iteration,
          double convergence_threshold)

{
  int iVar1;
  
  this->_vptr_AutocorrelationToCompositeSinusoidalModeling =
       (_func_int **)&PTR__AutocorrelationToCompositeSinusoidalModeling_00112c68;
  this->num_order_ = num_order;
  iVar1 = (num_order - (num_order + 1 >> 0x1f)) + 1 >> 1;
  this->num_sine_wave_ = iVar1;
  SymmetricSystemSolver::SymmetricSystemSolver(&this->symmetric_system_solver_,iVar1 + -1);
  DurandKernerMethod::DurandKernerMethod
            (&this->durand_kerner_method_,this->num_sine_wave_,num_iteration,convergence_threshold);
  VandermondeSystemSolver::VandermondeSystemSolver
            (&this->vandermonde_system_solver_,this->num_sine_wave_ + -1);
  this->is_valid_ = true;
  if (((((this->num_order_ & 0x80000001U) != 1) ||
       ((this->symmetric_system_solver_).is_valid_ != true)) ||
      ((this->durand_kerner_method_).is_valid_ != true)) ||
     ((this->vandermonde_system_solver_).is_valid_ == false)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

AutocorrelationToCompositeSinusoidalModeling::
    AutocorrelationToCompositeSinusoidalModeling(int num_order,
                                                 int num_iteration,
                                                 double convergence_threshold)
    : num_order_(num_order),
      num_sine_wave_((num_order_ + 1) / 2),
      symmetric_system_solver_(num_sine_wave_ - 1),
      durand_kerner_method_(num_sine_wave_, num_iteration,
                            convergence_threshold),
      vandermonde_system_solver_(num_sine_wave_ - 1),
      is_valid_(true) {
  if (num_order_ < 0 || 0 == num_order_ % 2 ||
      !symmetric_system_solver_.IsValid() || !durand_kerner_method_.IsValid() ||
      !vandermonde_system_solver_.IsValid()) {
    is_valid_ = false;
    return;
  }
}